

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QHighDpiScaling::ScreenFactor*>,long_long>
               (reverse_iterator<QHighDpiScaling::ScreenFactor_*> first,longlong n,
               reverse_iterator<QHighDpiScaling::ScreenFactor_*> d_first)

{
  ScreenFactor *pSVar1;
  Data *pDVar2;
  undefined8 uVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  int *piVar6;
  ScreenFactor *pSVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ScreenFactor *pSVar10;
  ScreenFactor *pSVar11;
  long in_FS_OFFSET;
  Destructor local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.end.current = (ScreenFactor *)((d_first.current)->name).d.d;
  pSVar10 = local_38.end.current + -n;
  pSVar1 = (ScreenFactor *)((first.current)->name).d.d;
  pSVar11 = pSVar1;
  pSVar7 = pSVar10;
  if (pSVar10 < pSVar1) {
    pSVar11 = pSVar10;
    pSVar7 = pSVar1;
  }
  pSVar1 = (ScreenFactor *)((d_first.current)->name).d.d;
  while (pSVar1 != pSVar7) {
    pDVar2 = ((first.current)->name).d.d;
    uVar3 = *(undefined8 *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    *(undefined8 *)&pSVar1[-1].name.d.d = uVar3;
    pcVar4 = (char16_t *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pSVar1[-1].name.d.ptr = pcVar4;
    qVar5 = *(qsizetype *)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pSVar1[-1].name.d.size = qVar5;
    pSVar1[-1].factor = (qreal)pDVar2[-1].super_QArrayData.alloc;
    ((d_first.current)->name).d.d = ((d_first.current)->name).d.d + -2;
    ((first.current)->name).d.d = ((first.current)->name).d.d + -2;
    pSVar1 = (ScreenFactor *)((d_first.current)->name).d.d;
  }
  local_38.iter = &local_38.end;
  local_38.intermediate.current = (ScreenFactor *)((d_first.current)->name).d.d;
  while (pSVar1 = (ScreenFactor *)((d_first.current)->name).d.d, pSVar1 != pSVar10) {
    pDVar2 = ((first.current)->name).d.d;
    uVar3 = *(undefined8 *)&pSVar1[-1].name.d.d;
    *(undefined8 *)&pSVar1[-1].name.d.d = *(undefined8 *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (QBasicAtomicInt)(int)uVar3;
    pDVar2[-2].super_QArrayData.flags = (ArrayOptions)(int)((ulong)uVar3 >> 0x20);
    pcVar4 = pSVar1[-1].name.d.ptr;
    pSVar1[-1].name.d.ptr = (char16_t *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = (qsizetype)pcVar4;
    uVar8 = *(undefined4 *)&pSVar1[-1].name.d.size;
    uVar9 = *(undefined4 *)((long)&pSVar1[-1].name.d.size + 4);
    pSVar1[-1].name.d.size = *(qsizetype *)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (QBasicAtomicInt)uVar8;
    pDVar2[-1].super_QArrayData.flags = (ArrayOptions)uVar9;
    pSVar1[-1].factor = (qreal)pDVar2[-1].super_QArrayData.alloc;
    ((d_first.current)->name).d.d = ((d_first.current)->name).d.d + -2;
    ((first.current)->name).d.d = ((first.current)->name).d.d + -2;
  }
  while (pSVar1 = (ScreenFactor *)((first.current)->name).d.d, pSVar1 != pSVar11) {
    ((first.current)->name).d.d = (Data *)(pSVar1 + 1);
    piVar6 = *(int **)&(pSVar1->name).d.d;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pSVar1->name).d.d,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QHighDpiScaling::ScreenFactor_*>,_long_long>
  ::Destructor::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}